

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::OnStateChange(CGameClient *this,int NewState,int OldState)

{
  long *plVar1;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar2;
  
  if (in_ESI < 3) {
    OnReset((CGameClient *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x210); iVar2 = iVar2 + 1) {
    plVar1 = *(long **)(in_RDI + 0x10 + (long)iVar2 * 8);
    (**(code **)(*plVar1 + 0x10))(plVar1,in_ESI,in_EDX);
  }
  return;
}

Assistant:

void CGameClient::OnStateChange(int NewState, int OldState)
{
	// reset everything when not already connected (to keep gathered stuff)
	if(NewState < IClient::STATE_ONLINE)
		OnReset();

	// then change the state
	for(int i = 0; i < m_All.m_Num; i++)
		m_All.m_paComponents[i]->OnStateChange(NewState, OldState);
}